

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O2

string * __thiscall
flatbuffers::cpp::CppGenerator::TablePackSignature_abi_cxx11_
          (string *__return_storage_ptr__,CppGenerator *this,StructDef *struct_def,bool inclass,
          IDLOptions *opts)

{
  string *psVar1;
  undefined7 in_register_00000009;
  char *__s;
  char *__rhs;
  allocator<char> local_299;
  string *local_298;
  string local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  __s = "static ";
  __rhs = "";
  if ((int)CONCAT71(in_register_00000009,inclass) == 0) {
    __s = "";
  }
  local_298 = __return_storage_ptr__;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_299);
  std::operator+(&local_1d0,&local_50,"::flatbuffers::Offset<");
  EscapeKeyword(&local_1f0,this,(string *)struct_def);
  std::operator+(&local_1b0,&local_1d0,&local_1f0);
  std::operator+(&local_190,&local_1b0,"> ");
  if (inclass) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_270,"",(allocator<char> *)&local_290);
  }
  else {
    EscapeKeyword(&local_290,this,(string *)struct_def);
    std::operator+(&local_270,&local_290,"::");
  }
  std::operator+(&local_170,&local_190,&local_270);
  std::operator+(&local_150,&local_170,"Pack(");
  GetBuilder_abi_cxx11_(&local_210,this);
  std::operator+(&local_130,&local_150,&local_210);
  std::operator+(&local_110,&local_130," &_fbb, ");
  std::operator+(&local_f0,&local_110,"const ");
  EscapeKeyword(&local_250,this,(string *)struct_def);
  NativeName(&local_230,&local_250,struct_def,opts);
  std::operator+(&local_d0,&local_f0,&local_230);
  std::operator+(&local_b0,&local_d0,"* _o, ");
  std::operator+(&local_90,&local_b0,"const ::flatbuffers::rehasher_function_t *_rehasher");
  if (inclass) {
    __rhs = " = nullptr";
  }
  std::operator+(&local_70,&local_90,__rhs);
  psVar1 = local_298;
  std::operator+(local_298,&local_70,")");
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_270);
  if (!inclass) {
    std::__cxx11::string::~string((string *)&local_290);
  }
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_50);
  return psVar1;
}

Assistant:

std::string TablePackSignature(const StructDef &struct_def, bool inclass,
                                 const IDLOptions &opts) {
    return std::string(inclass ? "static " : "") + "::flatbuffers::Offset<" +
           Name(struct_def) + "> " + (inclass ? "" : Name(struct_def) + "::") +
           "Pack(" + GetBuilder() + " &_fbb, " + "const " +
           NativeName(Name(struct_def), &struct_def, opts) + "* _o, " +
           "const ::flatbuffers::rehasher_function_t *_rehasher" +
           (inclass ? " = nullptr" : "") + ")";
  }